

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseEncoder.cpp
# Opt level: O0

void __thiscall siamese::EncoderPacketWindow::ResetSums(EncoderPacketWindow *this,uint elementStart)

{
  uint uVar1;
  uint in_ESI;
  EncoderPacketWindow *in_RDI;
  uint sumIndex;
  uint nextElement;
  uint laneIndex;
  uint local_30;
  uint local_28;
  
  for (local_28 = 0; local_28 < 8; local_28 = local_28 + 1) {
    uVar1 = GetNextLaneElement(in_RDI,in_ESI,local_28);
    for (local_30 = 0; local_30 < 3; local_30 = local_30 + 1) {
      in_RDI->Lanes[local_28].NextElement[local_30] = uVar1;
      in_RDI->Lanes[local_28].Sum[local_30].Bytes = 0;
    }
  }
  in_RDI->SumStartElement = in_ESI;
  in_RDI->SumEndElement = in_ESI;
  in_RDI->SumColumnStart = in_ESI + in_RDI->ColumnStart & 0x3fffff;
  in_RDI->SumErasedCount = 0;
  return;
}

Assistant:

void EncoderPacketWindow::ResetSums(unsigned elementStart)
{
    // Recreate all the sums from scratch after this:
    for (unsigned laneIndex = 0; laneIndex < kColumnLaneCount; ++laneIndex)
    {
        // Calculate first element to accumulate for this lane
        const unsigned nextElement = GetNextLaneElement(elementStart, laneIndex);

        for (unsigned sumIndex = 0; sumIndex < kColumnSumCount; ++sumIndex)
        {
            Lanes[laneIndex].NextElement[sumIndex] = nextElement;
            Lanes[laneIndex].Sum[sumIndex].Bytes   = 0;
        }
    }

    SumStartElement = elementStart;
    SumEndElement   = elementStart;
    SumColumnStart  = ElementToColumn(elementStart);
    SumErasedCount  = 0;
}